

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Pack.h
# Opt level: O2

axl_va_list * __thiscall
axl::sl::Pack<unsigned_int>::operator()
          (axl_va_list *__return_storage_ptr__,Pack<unsigned_int> *this,void *p,size_t *size,
          axl_va_list *va)

{
  undefined8 uVar1;
  uint uVar2;
  
  uVar2 = axl_va_list::arg<unsigned_int>(va);
  *size = 4;
  if (p != (void *)0x0) {
    *(uint *)p = uVar2;
  }
  __return_storage_ptr__->m_isInitialized = false;
  uVar1 = *(undefined8 *)&va->field_0x8;
  *(undefined8 *)__return_storage_ptr__ = *(undefined8 *)va;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = uVar1;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = *(undefined8 *)&va->field_0x10;
  __return_storage_ptr__->m_isInitialized = true;
  return __return_storage_ptr__;
}

Assistant:

axl_va_list
	operator () (
		void* p,
		size_t* size,
		axl_va_list va
	) {
		T a = va.arg<T> ();

		*size = sizeof(T);

		if (p)
			*(T*)p = a;

		return va;
	}